

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_4;
  UnarySelectPropertyExprSyntax *pUVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_59;
  Token local_58;
  Token local_48;
  Token local_38;
  SyntaxNode *local_28;
  
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_58 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x38) == (SyntaxNode *)0x0) {
    local_28 = (SyntaxNode *)0x0;
  }
  else {
    local_28 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x38),(DeepCloneVisitor *)&local_38,
                          (BumpAllocator *)__child_stack);
  }
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x40),(BumpAllocator *)__child_stack);
  args_4 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x50),&local_59,(BumpAllocator *)__child_stack);
  pUVar1 = BumpAllocator::
           emplace<slang::syntax::UnarySelectPropertyExprSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SelectorSyntax*,slang::parsing::Token,slang::syntax::PropertyExprSyntax&>
                     ((BumpAllocator *)__child_stack,&local_48,&local_58,
                      (SelectorSyntax **)&local_28,&local_38,(PropertyExprSyntax *)args_4);
  return (int)pUVar1;
}

Assistant:

static SyntaxNode* clone(const UnarySelectPropertyExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<UnarySelectPropertyExprSyntax>(
        node.op.deepClone(alloc),
        node.openBracket.deepClone(alloc),
        node.selector ? deepClone(*node.selector, alloc) : nullptr,
        node.closeBracket.deepClone(alloc),
        *deepClone<PropertyExprSyntax>(*node.expr, alloc)
    );
}